

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_global_variables(Impl *this)

{
  GlobalVariable *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  LinkageTypes LVar4;
  Id IVar5;
  Id IVar6;
  StorageClass SVar7;
  Module *this_01;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  _Var8;
  IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
  IVar9;
  Type *pTVar10;
  ArrayType *pAVar11;
  Builder *pBVar12;
  Builder *pBVar13;
  uint64_t uVar14;
  Constant *constant;
  LoggingCallback p_Var15;
  void *pvVar16;
  char cVar17;
  char buffer [4096];
  
  this_01 = LLVMBCParser::get_module(this->bitcode_parser);
  if ((4 < this->execution_model - ExecutionModelIntersectionKHR) ||
     ((bVar1 = emit_incoming_payload(this), bVar1 &&
      ((2 < this->execution_model - ExecutionModelIntersectionKHR ||
       (bVar1 = emit_hit_attribute(this), bVar1)))))) {
    for (_Var8._M_current = (GlobalVariable **)LLVMBC::Module::global_begin(this_01);
        IVar9 = LLVMBC::Module::global_end(this_01),
        (__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
         )_Var8._M_current != IVar9.iter._M_current; _Var8._M_current = _Var8._M_current + 1) {
      this_00 = *_Var8._M_current;
      pTVar10 = LLVMBC::Value::getType((Value *)this_00);
      uVar3 = LLVMBC::Type::getAddressSpace(pTVar10);
      LVar4 = LLVMBC::GlobalVariable::getLinkage(this_00);
      cVar17 = (char)uVar3;
      if ((LVar4 != ExternalLinkage || cVar17 == '\x03') &&
         (LVar4 = LLVMBC::GlobalVariable::getLinkage(this_00), LVar4 != AppendingLinkage)) {
        if (cVar17 == '\x03') {
          if ((this->shader_analysis).require_wmma == true) {
            pTVar10 = LLVMBC::Value::getType((Value *)this_00);
            pTVar10 = LLVMBC::Type::getPointerElementType(pTVar10);
            pAVar11 = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar10);
            if (pAVar11 != (ArrayType *)0x0) {
              pTVar10 = LLVMBC::Type::getArrayElementType(&pAVar11->super_Type);
              bVar1 = false;
              IVar5 = get_type_id(this,pTVar10,0);
              uVar14 = LLVMBC::Type::getArrayNumElements(&pAVar11->super_Type);
              pTVar10 = LLVMBC::Type::getArrayElementType(&pAVar11->super_Type);
              uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
              pBVar12 = builder(this);
              pBVar13 = builder(this);
              IVar6 = spv::Builder::makeUintConstant
                                (pBVar13,((int)uVar14 + 0x1000 / uVar3) - 1 & -(0x1000 / uVar3),
                                 false);
              IVar5 = spv::Builder::makeArrayType(pBVar12,IVar5,IVar6,0);
              goto LAB_00117928;
            }
          }
LAB_00117934:
          bVar1 = false;
LAB_0011793c:
          pTVar10 = LLVMBC::Value::getType((Value *)this_00);
          pTVar10 = LLVMBC::Type::getPointerElementType(pTVar10);
          IVar5 = get_type_id(this,pTVar10,0);
          if (IVar5 == 0) goto LAB_00117a3c;
        }
        else {
          if (((((uVar3 & 0xff) != 0) || ((this->options).extended_robustness.constant_lut != true))
              || (bVar1 = LLVMBC::GlobalVariable::hasInitializer(this_00), !bVar1)) ||
             (bVar1 = LLVMBC::GlobalVariable::isConstant(this_00), !bVar1)) goto LAB_00117934;
          pTVar10 = LLVMBC::Value::getType((Value *)this_00);
          pTVar10 = LLVMBC::Type::getPointerElementType(pTVar10);
          pAVar11 = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar10);
          if (pAVar11 == (ArrayType *)0x0) {
            bVar1 = false;
            goto LAB_0011793c;
          }
          pTVar10 = LLVMBC::Type::getArrayElementType(&pAVar11->super_Type);
          IVar5 = get_type_id(this,pTVar10,0);
          pBVar12 = builder(this);
          pBVar13 = builder(this);
          uVar14 = LLVMBC::Type::getArrayNumElements(&pAVar11->super_Type);
          IVar6 = spv::Builder::makeUintConstant(pBVar13,(int)uVar14 + 1,false);
          IVar5 = spv::Builder::makeArrayType(pBVar12,IVar5,IVar6,0);
          bVar1 = true;
LAB_00117928:
          if (IVar5 == 0) goto LAB_0011793c;
        }
        bVar2 = LLVMBC::GlobalVariable::hasInitializer(this_00);
        if ((bVar2) &&
           (constant = LLVMBC::GlobalVariable::getInitializer(this_00), constant != (Constant *)0x0)
           ) {
          bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(&constant->super_Value);
          if (cVar17 != '\x03' || bVar2) {
            if (bVar2) goto LAB_0011799b;
            if (bVar1) {
              IVar6 = get_padded_constant_array(this,IVar5,constant);
            }
            else {
              IVar6 = get_id_for_constant(this,constant,0);
            }
            goto LAB_0011799e;
          }
          p_Var15 = get_thread_log_callback();
          if (p_Var15 == (LoggingCallback)0x0) {
            fwrite("[WARN]: Global variable address space cannot have initializer! Ignoring ...\n",
                   0x4c,1,_stderr);
            fflush(_stderr);
          }
          else {
            memcpy(buffer,"Global variable address space cannot have initializer! Ignoring ...\n",
                   0x45);
            pvVar16 = get_thread_log_callback_userdata();
            (*p_Var15)(pvVar16,Warn,buffer);
          }
          IVar6 = 0;
LAB_001179e5:
          SVar7 = StorageClassWorkgroup;
        }
        else {
LAB_0011799b:
          IVar6 = 0;
LAB_0011799e:
          SVar7 = StorageClassPrivate;
          if (cVar17 == '\x03') goto LAB_001179e5;
        }
        SVar7 = get_effective_storage_class(this,(Value *)this_00,SVar7);
        IVar5 = create_variable_with_initializer(this,SVar7,IVar5,IVar6,(char *)0x0);
        pTVar10 = LLVMBC::Value::getType((Value *)this_00);
        pTVar10 = LLVMBC::Type::getPointerElementType(pTVar10);
        decorate_relaxed_precision(this,pTVar10,IVar5,false);
        rewrite_value(this,(Value *)this_00,IVar5);
      }
LAB_00117a3c:
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Converter::Impl::emit_global_variables()
{
	auto &module = bitcode_parser.get_module();

	if (execution_model_has_incoming_payload(execution_model))
		if (!emit_incoming_payload())
			return false;

	if (execution_model_has_hit_attribute(execution_model))
		if (!emit_hit_attribute())
			return false;

	for (auto itr = module.global_begin(); itr != module.global_end(); ++itr)
	{
		llvm::GlobalVariable &global = *itr;

		auto address_space = static_cast<DXIL::AddressSpace>(global.getType()->getAddressSpace());

		// Workarounds for DXR. RT resources tend to be declared with external linkage + structs.
		// Groupshared is also declared with external linkage, even if that is bogus.
		// Make sure we declare global internal struct LUTs at the very least ...
		if (global.getLinkage() == llvm::GlobalVariable::ExternalLinkage &&
		    address_space != DXIL::AddressSpace::GroupShared)
		{
			continue;
		}

		// Ignore @llvm.global_ctors(). Only observed once with dummy ctor.
		// It probably is not intended to work.
		if (global.getLinkage() == llvm::GlobalVariable::AppendingLinkage)
			continue;

		spv::Id pointee_type_id = 0;
		spv::Id scalar_type_id = 0;
		bool padded_composite = false;

		if (address_space == DXIL::AddressSpace::Thread &&
		    options.extended_robustness.constant_lut &&
		    global.hasInitializer() &&
		    global.isConstant())
		{
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(array_type->getArrayNumElements() + 1), false);
				padded_composite = true;
			}
		}
		else if (address_space == DXIL::AddressSpace::GroupShared &&
		         shader_analysis.require_wmma)
		{
			// Workaround for bugged WMMA shaders.
			// The shaders rely on AMD aligning LDS size to 512 bytes.
			// This avoids overflow spilling into LDSTranspose area by mistake, which breaks some shaders.
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				uint32_t elem_count = array_type->getArrayNumElements();
				uint32_t alignment = (512 * 8) / array_type->getArrayElementType()->getIntegerBitWidth();
				elem_count = (elem_count + alignment - 1) & ~(alignment - 1);
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(elem_count), false);
			}
		}

		if (!pointee_type_id)
			pointee_type_id = get_type_id(global.getType()->getPointerElementType());

		// Happens for some global variables in DXR for some reason, benign.
		if (pointee_type_id == 0)
			continue;

		spv::Id initializer_id = 0;

		llvm::Constant *initializer = nullptr;
		if (global.hasInitializer())
			initializer = global.getInitializer();
		if (initializer && llvm::isa<llvm::UndefValue>(initializer))
			initializer = nullptr;

		if (address_space == DXIL::AddressSpace::GroupShared)
		{
			if (initializer)
			{
				// FIXME: Is this even legal DXIL?
				LOGW("Global variable address space cannot have initializer! Ignoring ...\n");
				initializer = nullptr;
			}
		}

		if (initializer)
		{
			if (padded_composite)
				initializer_id = get_padded_constant_array(pointee_type_id, initializer);
			else
				initializer_id = get_id_for_constant(initializer, 0);
		}

		spv::StorageClass storage_class = address_space == DXIL::AddressSpace::GroupShared
		                                  ? spv::StorageClassWorkgroup : spv::StorageClassPrivate;
		spv::Id var_id = create_variable_with_initializer(
			get_effective_storage_class(&global, storage_class),
			pointee_type_id, initializer_id);

		decorate_relaxed_precision(global.getType()->getPointerElementType(), var_id, false);
		rewrite_value(&global, var_id);
	}

	return true;
}